

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_expanded_sql(sqlite3_stmt *pStmt)

{
  char *zRawSql;
  Vdbe *p;
  char *zSql;
  char *z;
  sqlite3_stmt *pStmt_local;
  
  zSql = (char *)0x0;
  zRawSql = sqlite3_sql(pStmt);
  if (zRawSql != (char *)0x0) {
    sqlite3_mutex_enter(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    zSql = sqlite3VdbeExpandSql((Vdbe *)pStmt,zRawSql);
    sqlite3_mutex_leave(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
  }
  return zSql;
}

Assistant:

SQLITE_API char *sqlite3_expanded_sql(sqlite3_stmt *pStmt){
#ifdef SQLITE_OMIT_TRACE
  return 0;
#else
  char *z = 0;
  const char *zSql = sqlite3_sql(pStmt);
  if( zSql ){
    Vdbe *p = (Vdbe *)pStmt;
    sqlite3_mutex_enter(p->db->mutex);
    z = sqlite3VdbeExpandSql(p, zSql);
    sqlite3_mutex_leave(p->db->mutex);
  }
  return z;
#endif
}